

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O3

_Bool borg_caution_teleport(wchar_t emergency,wchar_t turns)

{
  loc_conflict grid1;
  int iVar1;
  int iVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  wchar_t wVar9;
  loc_conflict grid2;
  char *what;
  uint uVar10;
  int iVar11;
  wchar_t wVar12;
  long lVar13;
  uint uVar14;
  wchar_t local_6c;
  borg_grid *local_58;
  
  wVar12 = w_x;
  local_58 = borg_grids[borg.c.y];
  lVar13 = (long)borg.c.x;
  wVar4 = borg_panel_wid();
  wVar9 = w_y;
  wVar5 = borg_panel_hgt();
  iVar6 = wVar9 / wVar5;
  if ((borg.trait[0xd3] == 0) || (local_6c = L'\0', borg.trait[0xd4] == 0)) {
    _Var3 = false;
  }
  else {
    local_58 = local_58 + lVar13;
    lVar13 = (long)(wVar12 / wVar4);
    iVar11 = 0;
    do {
      uVar14 = 0;
      do {
        do {
          iVar2 = borg.c.y;
          uVar7 = Rand_div(0xc9);
          iVar1 = borg.c.x;
          wVar12 = iVar2 + uVar7 + L'\xffffff9c';
          uVar8 = Rand_div(0xc9);
          wVar4 = uVar8 + iVar1 + L'\xffffff9c';
          grid2 = loc(wVar4,wVar12);
          grid1.y = borg.c.y;
          grid1.x = borg.c.x;
          wVar9 = distance(grid1,grid2);
        } while (0x32 < (uint)(wVar9 + L'\xffffffce'));
        if ((0xffffff3b < (uVar8 + iVar1) - 0x129 && 0xffffffbf < (uVar7 + iVar2) - 0xa5) &&
           (((local_58 = borg_grids[(uint)wVar12] + (uint)wVar4, local_58->feat != '\0' ||
             (((((borg_detect_wall[iVar6][lVar13] != true ||
                 (borg_detect_wall[iVar6][lVar13 + 1] != true)) ||
                (borg_detect_wall[iVar6 + 1][lVar13] != true)) ||
               (borg_detect_wall[iVar6 + 1][lVar13 + 1] == false)) && (borg_t < 0x7d1)))) &&
            (((_Var3 = borg_cave_floor_bold(wVar12,wVar4), _Var3 && (local_58->kill == '\0')) &&
             (local_58->web != true)))))) goto LAB_00206584;
        uVar14 = uVar14 + 1;
      } while (uVar14 != 100);
      uVar14 = 100;
LAB_00206584:
      if (local_58->feat == '\0') {
        uVar10 = 1;
        if (uVar14 < 100 && 0x1d < borg.trait[0x1c]) goto LAB_0020659d;
      }
      else {
        uVar10 = 1;
        if (uVar14 < 100) {
LAB_0020659d:
          wVar9 = borg_danger(wVar12,wVar4,turns,true,false);
          uVar10 = (uint)(borg.trait[0x1b] < wVar9);
        }
      }
      local_6c = local_6c + uVar10;
      iVar11 = iVar11 + 1;
    } while (iVar11 != 100);
    _Var3 = true;
    if (emergency < local_6c) {
      _Var3 = false;
      what = format("# No Teleport. scary squares: %d");
      borg_note(what);
    }
  }
  return _Var3;
}

Assistant:

bool borg_caution_teleport(int emergency, int turns)
{
    int n, k, i, d, x, y, p;

    int dis = 100;
    int min = dis / 2;
    int q_x, q_y;

    borg_grid *ag = &borg_grids[borg.c.y][borg.c.x];

    /* Extract panel */
    q_x = w_x / borg_panel_wid();
    q_y = w_y / borg_panel_hgt();

    /* must have the ability */
    if (!borg.trait[BI_ATELEPORT] || !borg.trait[BI_AESCAPE])
        return false;

    /* Simulate 100 attempts */
    for (n = k = 0; k < 100; k++) {
        /* Pick a location */
        for (i = 0; i < 100; i++) {
            /* Pick a (possibly illegal) location */
            while (1) {
                y = rand_spread(borg.c.y, dis);
                x = rand_spread(borg.c.x, dis);
                d = distance(borg.c, loc(x, y));
                if ((d >= min) && (d <= dis))
                    break;
            }

            /* Ignore illegal locations */
            if ((y <= 0) || (y >= AUTO_MAX_Y - 1))
                continue;
            if ((x <= 0) || (x >= AUTO_MAX_X - 1))
                continue;

            /* Access */
            ag = &borg_grids[y][x];

            /* Skip unknown grids if explored, or been on level for a while,
             * otherwise, consider ok*/
            if (ag->feat == FEAT_NONE
                && ((borg_detect_wall[q_y + 0][q_x + 0] == true
                        && borg_detect_wall[q_y + 0][q_x + 1] == true
                        && borg_detect_wall[q_y + 1][q_x + 0] == true
                        && borg_detect_wall[q_y + 1][q_x + 1] == true)
                    || borg_t > 2000))
                continue;

            /* Skip walls */
            if (!borg_cave_floor_bold(y, x))
                continue;

            /* Skip monsters */
            if (ag->kill)
                continue;

            /* Skip webs */
            if (ag->web)
                continue;

            /* Stop looking */
            break;
        }

        /* If low level, unknown squares are scary */
        if (ag->feat == FEAT_NONE && borg.trait[BI_MAXHP] < 30) {
            n++;
            continue;
        }

        /* No location */
        /* in the real code it would keep trying but here we should */
        /* assume that there is unknown spots that you would be able */
        /* to go but may be dangerous. */
        if (i >= 100) {
            n++;
            continue;
        }

        /* Examine */
        p = borg_danger(y, x, turns, true, false);

        /* if *very* scary, do not allow jumps at all */
        if (p > borg.trait[BI_CURHP])
            n++;
    }

    /* Too much danger */
    /* in an emergency try with extra danger allowed */
    if (n > emergency) {
        borg_note(format("# No Teleport. scary squares: %d", n));
        return false;
    }
    /* Okay */
    return true;
}